

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Median_patch(int g_a,int *alo,int *ahi,int g_b,int *blo,int *bhi,int g_c,int *clo,int *chi,
                    int g_m,int *mlo,int *mhi)

{
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  Integer IVar4;
  Integer *pIVar5;
  long lVar6;
  long lVar7;
  Integer _ga_mhi [7];
  Integer _ga_mlo [7];
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  IVar1 = pnga_ndim((long)g_a);
  IVar2 = pnga_ndim((long)g_b);
  IVar3 = pnga_ndim((long)g_c);
  IVar4 = pnga_ndim((long)g_m);
  lVar7 = 0;
  lVar6 = 0;
  if (0 < IVar1) {
    lVar6 = IVar1;
  }
  pIVar5 = _ga_alo + IVar1 + -1;
  for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)alo[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  pIVar5 = _ga_ahi + IVar1 + -1;
  for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)ahi[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  lVar7 = 0;
  lVar6 = 0;
  if (0 < IVar2) {
    lVar6 = IVar2;
  }
  pIVar5 = _ga_blo + IVar2 + -1;
  for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)blo[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  pIVar5 = _ga_bhi + IVar2 + -1;
  for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)bhi[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  lVar7 = 0;
  lVar6 = 0;
  if (0 < IVar3) {
    lVar6 = IVar3;
  }
  pIVar5 = _ga_clo + IVar3 + -1;
  for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)clo[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  pIVar5 = _ga_chi + IVar3 + -1;
  for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)chi[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  lVar7 = 0;
  lVar6 = 0;
  if (0 < IVar4) {
    lVar6 = IVar4;
  }
  pIVar5 = _ga_mlo + IVar4 + -1;
  for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)mlo[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  pIVar5 = _ga_mhi + IVar4 + -1;
  for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    *pIVar5 = (long)mhi[lVar7] + 1;
    pIVar5 = pIVar5 + -1;
  }
  pnga_median_patch((long)g_a,_ga_alo,_ga_ahi,(long)g_b,_ga_blo,_ga_bhi,(long)g_c,_ga_clo,_ga_chi,
                    (long)g_m,_ga_mlo,_ga_mhi);
  return;
}

Assistant:

void GA_Median_patch(int g_a, int *alo, int *ahi,
                     int g_b, int *blo, int *bhi,
                     int g_c, int *clo, int *chi,
                     int g_m, int *mlo, int *mhi){

   Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer c = (Integer)g_c;
    Integer m = (Integer )g_m;
    Integer andim = wnga_ndim(a);
    Integer bndim = wnga_ndim(b);
    Integer cndim = wnga_ndim(c);
    Integer mndim = wnga_ndim(m);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    Integer _ga_mlo[MAXDIM], _ga_mhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    COPYINDEX_C2F(mlo,_ga_mlo, mndim);
    COPYINDEX_C2F(mhi,_ga_mhi, mndim);
    wnga_median_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, c, _ga_clo, _ga_chi, m, _ga_mlo, _ga_mhi);
}